

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

void __thiscall FFlatVertexBuffer::CheckUpdate(FFlatVertexBuffer *this,sector_t *sector)

{
  uint uVar1;
  sector_t *sector_00;
  F3DFloor **ppFVar2;
  uint local_24;
  uint i;
  sector_t *hs;
  sector_t *sector_local;
  FFlatVertexBuffer *this_local;
  
  CheckPlanes(this,sector);
  sector_00 = sector_t::GetHeightSec(sector);
  if (sector_00 != (sector_t *)0x0) {
    CheckPlanes(this,sector_00);
  }
  local_24 = 0;
  while( true ) {
    uVar1 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&sector->e->XFloor);
    if (uVar1 <= local_24) break;
    ppFVar2 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)&sector->e->XFloor,(ulong)local_24);
    CheckPlanes(this,(*ppFVar2)->model);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CheckUpdate(sector_t *sector)
{
	CheckPlanes(sector);
	sector_t *hs = sector->GetHeightSec();
	if (hs != NULL) CheckPlanes(hs);
	for (unsigned i = 0; i < sector->e->XFloor.ffloors.Size(); i++)
		CheckPlanes(sector->e->XFloor.ffloors[i]->model);
}